

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

Rune re2::ApplyFold(CaseFold *f,Rune r)

{
  int iVar1;
  
  iVar1 = f->delta;
  if (iVar1 == -1) {
LAB_001dc40f:
    if ((r & 0x80000001U) == 1) {
      return r + 1;
    }
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 != 0x40000000) {
        if (iVar1 != 0x40000001) {
          return r + iVar1;
        }
        if ((r - f->lo & 1U) != 0) {
          return r;
        }
        goto LAB_001dc40f;
      }
      if ((r - f->lo & 1U) != 0) {
        return r;
      }
    }
    if ((r & 1U) == 0) {
      return r | 1;
    }
  }
  return r + -1;
}

Assistant:

Rune ApplyFold(const CaseFold *f, Rune r) {
  switch (f->delta) {
    default:
      return r + f->delta;

    case EvenOddSkip:  // even <-> odd but only applies to every other
      if ((r - f->lo) % 2)
        return r;
      FALLTHROUGH_INTENDED;
    case EvenOdd:  // even <-> odd
      if (r%2 == 0)
        return r + 1;
      return r - 1;

    case OddEvenSkip:  // odd <-> even but only applies to every other
      if ((r - f->lo) % 2)
        return r;
      FALLTHROUGH_INTENDED;
    case OddEven:  // odd <-> even
      if (r%2 == 1)
        return r + 1;
      return r - 1;
  }
}